

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O1

void __thiscall chrono::ChLinkClearance::UpdateForces(ChLinkClearance *this,double mytime)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ChFrameMoving<double> *this_00;
  ChBodyFrame *pCVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  Vector m_friction_F_abs;
  Vector temp;
  Vector m_V2_abs;
  Vector m_V1_abs;
  Vector pb2;
  Vector pb1;
  ChVector<double> local_e0;
  Vector local_c8;
  Vector local_b0;
  Vector local_98;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  ChVector<double> local_50;
  ChVector<double> local_38;
  
  local_e0.m_data[0] = VNULL;
  local_e0.m_data[1] = DAT_00b90ac0;
  local_e0.m_data[2] = DAT_00b90ac8;
  dVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.react_force
          .m_data[0];
  if (((*(this->super_ChLinkLockLock).super_ChLinkLock.mask.super_ChLinkMask.constraints.
         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).super_ChConstraint.
      active == true) {
    Get_contact_P_abs(&local_b0,this);
    this_00 = &((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1
               )->super_ChFrameMoving<double>;
    dVar17 = local_b0.m_data[0] - (this_00->super_ChFrame<double>).coord.pos.m_data[0];
    dVar18 = local_b0.m_data[1] - (this_00->super_ChFrame<double>).coord.pos.m_data[1];
    dVar19 = local_b0.m_data[2] - (this_00->super_ChFrame<double>).coord.pos.m_data[2];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar17;
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         dVar18 * *(double *)
                   ((long)(this_00->super_ChFrame<double>).Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x18);
    auVar2 = vfmadd231sd_fma(auVar38,auVar27,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x30);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar19;
    auVar2 = vfmadd231sd_fma(auVar2,auVar36,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 8);
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         dVar18 * *(double *)
                   ((long)(this_00->super_ChFrame<double>).Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x20);
    auVar3 = vfmadd231sd_fma(auVar40,auVar27,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x38);
    auVar3 = vfmadd231sd_fma(auVar3,auVar36,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x10);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar17;
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         dVar18 * *(double *)
                   ((long)(this_00->super_ChFrame<double>).Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x28);
    auVar4 = vfmadd231sd_fma(auVar32,auVar28,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x40);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar19;
    auVar4 = vfmadd231sd_fma(auVar4,auVar37,auVar7);
    local_38.m_data[0] = auVar2._0_8_;
    local_38.m_data[1] = auVar3._0_8_;
    local_38.m_data[2] = auVar4._0_8_;
    pCVar16 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2;
    dVar17 = local_b0.m_data[0] -
             (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
    dVar18 = local_b0.m_data[1] -
             (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
    dVar19 = local_b0.m_data[2] -
             (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar17;
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         dVar18 * *(double *)
                   ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x18);
    auVar2 = vfmadd231sd_fma(auVar33,auVar22,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(double *)
                    ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data + 0x30);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar19;
    auVar2 = vfmadd231sd_fma(auVar2,auVar29,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         *(double *)
          ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8)
    ;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         dVar18 * *(double *)
                   ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x20);
    auVar3 = vfmadd231sd_fma(auVar35,auVar22,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         *(double *)
          ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x38);
    auVar3 = vfmadd231sd_fma(auVar3,auVar29,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         *(double *)
          ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x10);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar17;
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         dVar18 * *(double *)
                   ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x28);
    auVar4 = vfmadd231sd_fma(auVar26,auVar23,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         *(double *)
          ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x40);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar19;
    auVar4 = vfmadd231sd_fma(auVar4,auVar30,auVar13);
    local_50.m_data[0] = auVar2._0_8_;
    local_50.m_data[1] = auVar3._0_8_;
    local_50.m_data[2] = auVar4._0_8_;
    ChFrameMoving<double>::PointSpeedLocalToParent(this_00,&local_38);
    ChFrameMoving<double>::PointSpeedLocalToParent
              (&((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
                Body2)->super_ChFrameMoving<double>,&local_50);
    (this->contact_V_abs).m_data[0] = local_68 - local_80;
    (this->contact_V_abs).m_data[1] = local_60 - local_78;
    (this->contact_V_abs).m_data[2] = local_58 - local_70;
    Get_contact_N_abs(&local_c8,this);
    Get_contact_N_abs(&local_98,this);
    dVar17 = (this->contact_V_abs).m_data[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar17;
    dVar18 = (this->contact_V_abs).m_data[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_98.m_data[0];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar18 * local_98.m_data[1];
    auVar2 = vfmadd231sd_fma(auVar31,auVar24,auVar14);
    dVar19 = (this->contact_V_abs).m_data[2];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar19;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_98.m_data[2];
    auVar2 = vfmadd231sd_fma(auVar2,auVar34,auVar15);
    dVar21 = auVar2._0_8_;
    dVar17 = dVar17 - dVar21 * local_c8.m_data[0];
    dVar18 = dVar18 - dVar21 * local_c8.m_data[1];
    dVar19 = dVar19 - dVar21 * local_c8.m_data[2];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar18 * dVar18;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar17;
    auVar2 = vfmadd231sd_fma(auVar25,auVar39,auVar39);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar19;
    auVar2 = vfmadd231sd_fma(auVar2,auVar41,auVar41);
    if (auVar2._0_8_ < 0.0) {
      dVar21 = sqrt(auVar2._0_8_);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar2,auVar2);
      dVar21 = auVar2._0_8_;
    }
    bVar20 = 2.2250738585072014e-308 <= dVar21;
    dVar21 = 1.0 / dVar21;
    local_e0.m_data[2] = dVar1 * this->c_friction;
    local_e0.m_data[0] =
         local_e0.m_data[2] *
         (double)((ulong)bVar20 * (long)(dVar17 * dVar21) + (ulong)!bVar20 * 0x3ff0000000000000);
    local_e0.m_data[1] = local_e0.m_data[2] * (double)((ulong)bVar20 * (long)(dVar18 * dVar21));
    local_e0.m_data[2] = local_e0.m_data[2] * (double)((ulong)bVar20 * (long)(dVar19 * dVar21));
    ChMarker::Dir_World2Ref
              (&local_c8,(this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
               &local_e0);
    (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[0] =
         local_c8.m_data[0] +
         (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[0];
    (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[1] =
         local_c8.m_data[1] +
         (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[1];
    (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[2] =
         local_c8.m_data[2] +
         (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[2];
  }
  Get_contact_N_abs(&local_b0,this);
  (this->contact_F_abs).m_data[0] = local_e0.m_data[0] - dVar1 * local_b0.m_data[0];
  (this->contact_F_abs).m_data[1] = local_e0.m_data[1] - dVar1 * local_b0.m_data[1];
  (this->contact_F_abs).m_data[2] = local_e0.m_data[2] - dVar1 * local_b0.m_data[2];
  return;
}

Assistant:

void ChLinkClearance::UpdateForces(double mytime) {
    // May avoid inheriting parent class force computation, since not
    // needed...
    // LinkLock::UpdateForces(mytime);

    Vector m_friction_F_abs = VNULL;
    double m_norm_force = -this->react_force.x();

    // Just add Coulomb kinematic friction...

    if (mask.Constr_X().IsActive()) {
        Vector temp = Get_contact_P_abs();
        Vector pb1 = ((ChFrame<double>*)Body1)->TransformParentToLocal(temp);
        Vector pb2 = ((ChFrame<double>*)Body2)->TransformParentToLocal(temp);
        Vector m_V1_abs = Body1->PointSpeedLocalToParent(pb1);
        Vector m_V2_abs = Body2->PointSpeedLocalToParent(pb2);
        this->contact_V_abs = Vsub(m_V1_abs, m_V2_abs);
        Vector m_tang_V_abs = Vsub(contact_V_abs, Vmul(Get_contact_N_abs(), Vdot(contact_V_abs, Get_contact_N_abs())));

        // absolute friction force, as applied in contact point
        m_friction_F_abs = Vmul(Vnorm(m_tang_V_abs), Get_c_friction() * (-m_norm_force));

        // transform the friction force in link master coords ***TO CHECK*** (new version!)
        this->C_force += this->marker2->Dir_World2Ref(m_friction_F_abs);
    }

    // update internal data: the abs. vector of all contact forces, is a sum of reaction and friction
    this->contact_F_abs = Vadd(Vmul(Get_contact_N_abs(), m_norm_force), m_friction_F_abs);
}